

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::TiledFaceBase::~TiledFaceBase(TiledFaceBase *this)

{
  pointer ppFVar1;
  
  (this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
       (_func_int **)&PTR__TiledFaceBase_02d407a8;
  for (ppFVar1 = (this->_tiles).
                 super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (this->_tiles).
      super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    if (*ppFVar1 != (FaceData *)0x0) {
      (*((*ppFVar1)->super_PtexFaceData)._vptr_PtexFaceData[1])();
    }
  }
  std::
  _Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
  ::~_Vector_base(&(this->_tiles).
                   super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                 );
  return;
}

Assistant:

virtual ~TiledFaceBase() {
            for (std::vector<FaceData*>::iterator i = _tiles.begin(); i != _tiles.end(); ++i) {
                if (*i) delete *i;
            }
        }